

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O3

QByteArray * __thiscall
QHttpNetworkRequest::methodName(QByteArray *__return_storage_ptr__,QHttpNetworkRequest *this)

{
  QHttpNetworkRequestPrivate *pQVar1;
  Data *pDVar2;
  char *pcVar3;
  
  pQVar1 = (this->d).d.ptr;
  switch(pQVar1->operation) {
  case Options:
    pcVar3 = "OPTIONS";
    break;
  case Get:
    pcVar3 = "GET";
    break;
  case Head:
    pcVar3 = "HEAD";
    break;
  case Post:
    pcVar3 = "POST";
    break;
  case Put:
    pcVar3 = "PUT";
    break;
  case Delete:
    pcVar3 = "DELETE";
    break;
  case Trace:
    pcVar3 = "TRACE";
    break;
  case Connect:
    pcVar3 = "CONNECT";
    break;
  case Custom:
    pDVar2 = (pQVar1->customVerb).d.d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (pQVar1->customVerb).d.ptr;
    (__return_storage_ptr__->d).size = (pQVar1->customVerb).d.size;
    if (pDVar2 == (Data *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  QByteArray::QByteArray(__return_storage_ptr__,pcVar3,-1);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QHttpNetworkRequest::methodName() const
{
    switch (d->operation) {
    case QHttpNetworkRequest::Get:
        return "GET";
    case QHttpNetworkRequest::Head:
        return "HEAD";
    case QHttpNetworkRequest::Post:
        return "POST";
    case QHttpNetworkRequest::Options:
        return "OPTIONS";
    case QHttpNetworkRequest::Put:
        return "PUT";
    case QHttpNetworkRequest::Delete:
        return "DELETE";
    case QHttpNetworkRequest::Trace:
        return "TRACE";
    case QHttpNetworkRequest::Connect:
        return "CONNECT";
    case QHttpNetworkRequest::Custom:
        return d->customVerb;
    default:
        break;
    }
    return QByteArray();
}